

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

void __thiscall
Js::ByteCodeWriter::AddJumpOffset
          (ByteCodeWriter *this,OpCode op,ByteCodeLabel labelId,uint fieldByteOffsetFromEnd)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  int32 iVar5;
  ByteCodeLabel labelID;
  ByteCodeLabel labelID_00;
  undefined4 *puVar6;
  Type *pTVar7;
  undefined6 in_register_00000032;
  JumpInfo local_3c;
  JumpInfo jumpInfo;
  
  if (99 < fieldByteOffsetFromEnd) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0xa8e,"(fieldByteOffsetFromEnd < 100)","Ensure valid field offset")
    ;
    if (!bVar3) goto LAB_007cba7a;
    *puVar6 = 0;
  }
  jumpInfo.labelId = (ByteCodeLabel)CONCAT62(in_register_00000032,op);
  CheckOpen(this);
  CheckLabel(this,labelId);
  local_3c.patchOffset = (this->m_byteCodeData).currentOffset - fieldByteOffsetFromEnd;
  if (this->useBranchIsland == true) {
    this->nextBranchIslandOffset = this->nextBranchIslandOffset + -7;
    pTVar7 = JsUtil::
             List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item(this->m_labelOffsets,labelId);
    uVar1 = *pTVar7;
    if (uVar1 != 0xffffffff) {
      uVar4 = (this->m_byteCodeData).currentOffset;
      if (uVar4 <= uVar1) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0xa9f,"(labelOffset < m_byteCodeData.GetCurrentOffset())",
                                    "labelOffset < m_byteCodeData.GetCurrentOffset()");
        if (!bVar3) {
LAB_007cba7a:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
        uVar4 = (this->m_byteCodeData).currentOffset;
      }
      iVar5 = GetBranchLimit();
      if (SBORROW4(uVar1 - uVar4,-iVar5) != (int)((uVar1 - uVar4) + iVar5) < 0) {
        labelID = DefineLabel(this);
        local_3c.labelId = labelID;
        JsUtil::
        List<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::Add(this->m_jumpOffsets,&local_3c);
        bVar3 = OpCodeAttr::HasFallThrough((OpCode)jumpInfo.labelId);
        if (bVar3) {
          labelID_00 = DefineLabel(this);
          Br(this,labelID_00);
        }
        else {
          labelID_00 = -1;
        }
        MarkLabel(this,labelID);
        BrLong(this,BrLong,labelId);
        if (labelID_00 == -1) {
          return;
        }
        MarkLabel(this,labelID_00);
        return;
      }
    }
  }
  local_3c.labelId = labelId;
  JsUtil::
  List<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::Add(this->m_jumpOffsets,&local_3c);
  return;
}

Assistant:

void ByteCodeWriter::AddJumpOffset(Js::OpCode op, ByteCodeLabel labelId, uint fieldByteOffsetFromEnd) // Offset of "Offset" field in OpLayout, in bytes
    {
        AssertMsg(fieldByteOffsetFromEnd < 100, "Ensure valid field offset");
        CheckOpen();
        CheckLabel(labelId);

        uint jumpByteOffset = m_byteCodeData.GetCurrentOffset() - fieldByteOffsetFromEnd;
#ifdef BYTECODE_BRANCH_ISLAND
        if (useBranchIsland)
        {
            // Any Jump might need a long jump, account for that emit the branch island earlier.
            // Even if it is a back edge and we are going to emit a long jump, we will still
            // emit a branch around any way.
            this->nextBranchIslandOffset -= LongBranchSize;

            uint labelOffset = m_labelOffsets->Item(labelId);
            if (labelOffset != UINT_MAX)
            {
                // Back branch, see if it needs to be long
                Assert(labelOffset < m_byteCodeData.GetCurrentOffset());
                LongJumpOffset jumpOffset = labelOffset - m_byteCodeData.GetCurrentOffset();
                if (jumpOffset < -GetBranchLimit())
                {
                    // Create the long jump label and add the original jump offset to the list first
                    ByteCodeLabel longJumpLabel = this->DefineLabel();
                    JumpInfo jumpInfo = { longJumpLabel, jumpByteOffset };
                    m_jumpOffsets->Add(jumpInfo);

                    // Emit the jump around (if necessary)
                    ByteCodeLabel jumpAroundLabel = (ByteCodeLabel)-1;
                    if (OpCodeAttr::HasFallThrough(op))
                    {
                        // emit jump around.
                        jumpAroundLabel = this->DefineLabel();
                        this->Br(jumpAroundLabel);
                    }

                    // emit the long jump
                    this->MarkLabel(longJumpLabel);
                    this->BrLong(Js::OpCode::BrLong, labelId);

                    if (jumpAroundLabel != (ByteCodeLabel)-1)
                    {
                        this->MarkLabel(jumpAroundLabel);
                    }
                    return;
                }
            }
        }
#endif
        //
        // Branch targets are created in two passes:
        // - In the instruction stream, write "labelID" into "OpLayoutBrC.Offset".  Record this
        //   location in "m_jumpOffsets" to be patched later.
        // - When the byte-code is closed, update all "OpLayoutBrC.Offset"'s with their actual
        //   destinations.
        //

        JumpInfo jumpInfo = { labelId, jumpByteOffset };
        m_jumpOffsets->Add(jumpInfo);
    }